

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr.c
# Opt level: O0

int rtr_init(rtr_socket *rtr_socket,tr_socket *tr,pfx_table *pfx_table,spki_table *spki_table,
            aspa_table *aspa_table,uint refresh_interval,uint expire_interval,uint retry_interval,
            rtr_interval_mode iv_mode,rtr_connection_state_fp fp,void *fp_param_config,
            void *fp_param_group)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  uint refresh_interval_local;
  aspa_table *aspa_table_local;
  spki_table *spki_table_local;
  pfx_table *pfx_table_local;
  tr_socket *tr_local;
  rtr_socket *rtr_socket_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (tr != (tr_socket *)0x0) {
    rtr_socket->tr_socket = tr;
  }
  iVar2 = rtr_check_interval_range(refresh_interval,1,0x15180);
  if (iVar2 == 0) {
    iVar2 = rtr_check_interval_range(expire_interval,600,0x2a300);
    if (iVar2 == 0) {
      iVar2 = rtr_check_interval_range(retry_interval,1,0x1c20);
      if (iVar2 == 0) {
        rtr_socket->refresh_interval = refresh_interval;
        rtr_socket->expire_interval = expire_interval;
        rtr_socket->retry_interval = retry_interval;
        rtr_socket->iv_mode = iv_mode;
        rtr_socket->state = RTR_CLOSED;
        rtr_socket->request_session_id = true;
        rtr_socket->serial_number = 0;
        rtr_socket->last_update = 0;
        rtr_socket->pfx_table = pfx_table;
        rtr_socket->spki_table = spki_table;
        rtr_socket->aspa_table = aspa_table;
        rtr_socket->connection_state_fp = fp;
        rtr_socket->connection_state_fp_param_config = fp_param_config;
        rtr_socket->connection_state_fp_param_group = fp_param_group;
        rtr_socket->thread_id = 0;
        rtr_socket->version = 2;
        rtr_socket->has_received_pdus = false;
        rtr_socket->is_resetting = false;
        rtr_socket_local._4_4_ = 0;
        goto LAB_0010ca8b;
      }
    }
  }
  lrtr_dbg("RTR Socket: Interval value not in range.");
  rtr_socket_local._4_4_ = -2;
LAB_0010ca8b:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return rtr_socket_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

int rtr_init(struct rtr_socket *rtr_socket, struct tr_socket *tr, struct pfx_table *pfx_table,
	     struct spki_table *spki_table, struct aspa_table *aspa_table, const unsigned int refresh_interval,
	     const unsigned int expire_interval, const unsigned int retry_interval, enum rtr_interval_mode iv_mode,
	     rtr_connection_state_fp fp, void *fp_param_config, void *fp_param_group)
{
	if (tr)
		rtr_socket->tr_socket = tr;

	// Check if one of the intervals is not in range of the predefined values.
	if (rtr_check_interval_range(refresh_interval, RTR_REFRESH_MIN, RTR_REFRESH_MAX) != RTR_INSIDE_INTERVAL_RANGE ||
	    rtr_check_interval_range(expire_interval, RTR_EXPIRATION_MIN, RTR_EXPIRATION_MAX) !=
		    RTR_INSIDE_INTERVAL_RANGE ||
	    rtr_check_interval_range(retry_interval, RTR_RETRY_MIN, RTR_RETRY_MAX) != RTR_INSIDE_INTERVAL_RANGE) {
		RTR_DBG("Interval value not in range.");
		return RTR_INVALID_PARAM;
	}
	rtr_socket->refresh_interval = refresh_interval;
	rtr_socket->expire_interval = expire_interval;
	rtr_socket->retry_interval = retry_interval;
	rtr_socket->iv_mode = iv_mode;

	rtr_socket->state = RTR_CLOSED;
	rtr_socket->request_session_id = true;
	rtr_socket->serial_number = 0;
	rtr_socket->last_update = 0;
	rtr_socket->pfx_table = pfx_table;
	rtr_socket->spki_table = spki_table;
	rtr_socket->aspa_table = aspa_table;
	rtr_socket->connection_state_fp = fp;
	rtr_socket->connection_state_fp_param_config = fp_param_config;
	rtr_socket->connection_state_fp_param_group = fp_param_group;
	rtr_socket->thread_id = 0;
	rtr_socket->version = RTR_PROTOCOL_MAX_SUPPORTED_VERSION;
	rtr_socket->has_received_pdus = false;
	rtr_socket->is_resetting = false;
	return RTR_SUCCESS;
}